

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O0

int run_test_tcp_bind_writable_flags(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 auVar3 [16];
  undefined1 local_230 [4];
  int r;
  uv_shutdown_t shutdown_req;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_tcp_t server;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&server.queued_fds);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xe3,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xe5,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_bind(&buf.len,&server.queued_fds,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xe7,"r == 0");
    abort();
  }
  iVar1 = uv_listen(&buf.len,0x80,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xe9,"r == 0");
    abort();
  }
  iVar1 = uv_is_writable(&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xeb,"0 == uv_is_writable((uv_stream_t*) &server)");
    abort();
  }
  iVar1 = uv_is_readable(&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xec,"0 == uv_is_readable((uv_stream_t*) &server)");
    abort();
  }
  auVar3 = uv_buf_init("PING",4);
  buf.base = auVar3._8_8_;
  write_req.bufsml[3].len = auVar3._0_8_;
  iVar1 = uv_write(&shutdown_req.cb,&buf.len,&write_req.bufsml[3].len,1,0);
  if (iVar1 != -0x20) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xf0,"r == UV_EPIPE");
    abort();
  }
  iVar1 = uv_shutdown(local_230,&buf.len,0);
  if (iVar1 != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xf2,"r == UV_ENOTCONN");
    abort();
  }
  iVar1 = uv_read_start(&buf.len,0);
  if (iVar1 != -0x6b) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xf4,"r == UV_ENOTCONN");
    abort();
  }
  uv_close(&buf.len,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xfa,"close_cb_called == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xfc,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_bind_writable_flags) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_buf_t buf;
  uv_write_t write_req;
  uv_shutdown_t shutdown_req;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT(r == 0);

  ASSERT(0 == uv_is_writable((uv_stream_t*) &server));
  ASSERT(0 == uv_is_readable((uv_stream_t*) &server));

  buf = uv_buf_init("PING", 4);
  r = uv_write(&write_req, (uv_stream_t*) &server, &buf, 1, NULL);
  ASSERT(r == UV_EPIPE);
  r = uv_shutdown(&shutdown_req, (uv_stream_t*) &server, NULL);
  ASSERT(r == UV_ENOTCONN);
  r = uv_read_start((uv_stream_t*) &server, NULL, NULL);
  ASSERT(r == UV_ENOTCONN);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}